

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regex.cpp
# Opt level: O0

void test_match<std::__cxx11::string,booster::match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str)

{
  bool bVar1;
  byte bVar2;
  ostream *poVar3;
  runtime_error *prVar4;
  size_t sVar5;
  ostringstream oss_13;
  ostringstream oss_12;
  ostringstream oss_11;
  ostringstream oss_10;
  ostringstream oss_9;
  ostringstream oss_8;
  ostringstream oss_7;
  ostringstream oss_6;
  ostringstream oss_5;
  ostringstream oss_4;
  ostringstream oss_3;
  ostringstream oss_2;
  ostringstream oss_1;
  ostringstream oss;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cm;
  value_type *in_stack_ffffffffffffe1b8;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffe1c0;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffe1d0;
  undefined8 in_stack_ffffffffffffe1d8;
  int n;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffe1e0;
  undefined7 in_stack_ffffffffffffe200;
  undefined1 in_stack_ffffffffffffe207;
  string_type *in_stack_ffffffffffffe208;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *l;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffe210;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffe218;
  undefined8 in_stack_ffffffffffffe220;
  int flags;
  regex *in_stack_ffffffffffffe228;
  smatch *in_stack_ffffffffffffe230;
  undefined7 in_stack_ffffffffffffe238;
  undefined1 in_stack_ffffffffffffe23f;
  byte local_1bc1;
  string local_1b48 [32];
  ostringstream local_1b28 [383];
  undefined1 local_19a9 [57];
  string local_1970 [39];
  undefined1 local_1949;
  string local_1948 [32];
  ostringstream local_1928 [407];
  allocator local_1791;
  string local_1790 [32];
  string local_1770 [39];
  undefined1 local_1749;
  string local_1748 [32];
  ostringstream local_1728 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe908;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffe910;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  in_stack_ffffffffffffe920;
  string local_1598 [39];
  undefined1 local_1571;
  string local_1570 [32];
  ostringstream local_1550 [400];
  string local_13c0 [39];
  undefined1 local_1399;
  string local_1398 [32];
  ostringstream local_1378 [424];
  string local_11d0 [32];
  char *local_11b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_11a8;
  allocator local_1191;
  string local_1190 [39];
  allocator local_1169;
  string local_1168 [63];
  allocator local_1129;
  string local_1128 [279];
  undefined1 local_1011;
  string local_1010 [32];
  ostringstream local_ff0 [407];
  undefined1 local_e59;
  string local_e58 [32];
  ostringstream local_e38 [407];
  undefined1 local_ca1;
  string local_ca0 [32];
  ostringstream local_c80 [407];
  undefined1 local_ae9;
  string local_ae8 [32];
  ostringstream local_ac8 [407];
  undefined1 local_931;
  string local_930 [32];
  ostringstream local_910 [152];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff790;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  in_stack_fffffffffffff7a0;
  string local_778 [32];
  ostringstream local_758 [407];
  undefined1 local_5c1;
  string local_5c0 [32];
  ostringstream local_5a0 [392];
  byte local_418;
  byte local_400;
  byte local_3e8;
  byte local_3d0;
  byte local_3b8;
  undefined1 local_3a9;
  string local_3a8 [32];
  ostringstream local_388 [383];
  undefined1 local_209;
  string local_208 [32];
  ostringstream local_1e8 [399];
  allocator local_59;
  string local_58 [32];
  regex local_38 [56];
  
  n = (int)((ulong)in_stack_ffffffffffffe1d8 >> 0x20);
  flags = (int)((ulong)in_stack_ffffffffffffe220 >> 0x20);
  booster::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::match_results(in_stack_ffffffffffffe1d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"(a)(a)(x)?(b)",&local_59);
  booster::regex::regex(local_38,local_58,0);
  bVar1 = booster::regex_match<booster::regex>
                    ((string *)CONCAT17(in_stack_ffffffffffffe23f,in_stack_ffffffffffffe238),
                     in_stack_ffffffffffffe230,in_stack_ffffffffffffe228,flags);
  booster::regex::~regex(local_38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1e8);
    poVar3 = std::operator<<((ostream *)local_1e8,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x49);
    std::operator<<(poVar3," booster::regex_match(str,cm,booster::regex(\"(a)(a)(x)?(b)\"))");
    local_209 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_208);
    local_209 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar5 = booster::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x1144ea);
  if (sVar5 != 5) {
    std::__cxx11::ostringstream::ostringstream(local_388);
    poVar3 = std::operator<<((ostream *)local_388,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x4a);
    std::operator<<(poVar3," cm.size()==5");
    local_3a9 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_3a8);
    local_3a9 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_stack_ffffffffffffe1e0,n);
  local_1bc1 = 0;
  if ((local_3b8 & 1) != 0) {
    booster::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](in_stack_ffffffffffffe1e0,n);
    local_1bc1 = 0;
    if ((local_3d0 & 1) != 0) {
      booster::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](in_stack_ffffffffffffe1e0,n);
      local_1bc1 = 0;
      if ((local_3e8 & 1) != 0) {
        booster::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](in_stack_ffffffffffffe1e0,n);
        local_1bc1 = 0;
        if ((local_400 & 1) == 0) {
          booster::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](in_stack_ffffffffffffe1e0,n);
          local_1bc1 = local_418;
        }
      }
    }
  }
  if ((local_1bc1 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_5a0);
    poVar3 = std::operator<<((ostream *)local_5a0,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x4b);
    std::operator<<(poVar3,
                    " cm[0].matched && cm[1].matched && cm[1].matched && !cm[3].matched && cm[4].matched"
                   );
    local_5c1 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_5c0);
    local_5c1 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_stack_ffffffffffffe1e0,n);
  bVar1 = booster::operator==(in_stack_ffffffffffffe1c0,in_stack_ffffffffffffe1b8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_758);
    poVar3 = std::operator<<((ostream *)local_758,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x4d);
    std::operator<<(poVar3," cm[0]==\"aab\"");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_778);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_stack_ffffffffffffe1e0,n);
  bVar1 = booster::operator==(in_stack_ffffffffffffe1c0,in_stack_ffffffffffffe1b8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_910);
    poVar3 = std::operator<<((ostream *)local_910,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x4e);
    std::operator<<(poVar3," cm[1]==\"a\"");
    local_931 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_930);
    local_931 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_stack_ffffffffffffe1e0,n);
  bVar1 = booster::operator==(in_stack_ffffffffffffe1c0,in_stack_ffffffffffffe1b8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_ac8);
    poVar3 = std::operator<<((ostream *)local_ac8,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x4f);
    std::operator<<(poVar3," cm[2]==\"a\"");
    local_ae9 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_ae8);
    local_ae9 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_stack_ffffffffffffe1e0,n);
  bVar1 = booster::operator!=(in_stack_ffffffffffffe1c0,in_stack_ffffffffffffe1b8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_c80);
    poVar3 = std::operator<<((ostream *)local_c80,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x50);
    std::operator<<(poVar3," cm[3]!=\"a\"");
    local_ca1 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_ca0);
    local_ca1 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_stack_ffffffffffffe1e0,n);
  bVar1 = booster::operator==(in_stack_ffffffffffffe1c0,in_stack_ffffffffffffe1b8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_e38);
    poVar3 = std::operator<<((ostream *)local_e38,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x51);
    std::operator<<(poVar3," cm[3]==\"\"");
    local_e59 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_e58);
    local_e59 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_stack_ffffffffffffe1e0,n);
  bVar1 = booster::operator==(in_stack_ffffffffffffe1c0,in_stack_ffffffffffffe1b8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_ff0);
    poVar3 = std::operator<<((ostream *)local_ff0,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x52);
    std::operator<<(poVar3," cm[4]==\"b\"");
    local_1011 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_1010);
    local_1011 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_stack_ffffffffffffe1e0,n);
  booster::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_stack_ffffffffffffe1e0,n);
  check_equal<booster::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,booster::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
            (in_stack_ffffffffffffe910,in_stack_ffffffffffffe920);
  booster::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_stack_ffffffffffffe1e0,n);
  booster::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_stack_ffffffffffffe1e0,n);
  check_less<booster::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,booster::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
            ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff790,in_stack_fffffffffffff7a0);
  booster::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_stack_ffffffffffffe1e0,n);
  booster::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_stack_ffffffffffffe1e0,n);
  check_less<booster::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,booster::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
            ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff790,in_stack_fffffffffffff7a0);
  booster::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_stack_ffffffffffffe1e0,n);
  check_equal<booster::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,char_const*>
            (in_stack_ffffffffffffe910,(char *)in_stack_ffffffffffffe908);
  booster::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_stack_ffffffffffffe1e0,n);
  check_less<booster::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,char_const*>
            ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff790,(char *)in_stack_fffffffffffff788);
  booster::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_stack_ffffffffffffe1e0,n);
  check_less<char[1],booster::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
            ((char (*) [1])in_stack_fffffffffffff790,in_stack_fffffffffffff7a0);
  booster::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_stack_ffffffffffffe1e0,n);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1128,"a",&local_1129);
  check_equal<booster::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,std::__cxx11::string>
            (in_stack_ffffffffffffe910,in_stack_ffffffffffffe908);
  std::__cxx11::string::~string(local_1128);
  std::allocator<char>::~allocator((allocator<char> *)&local_1129);
  booster::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_stack_ffffffffffffe1e0,n);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1168,"b",&local_1169);
  check_less<booster::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,std::__cxx11::string>
            ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff790,in_stack_fffffffffffff788);
  std::__cxx11::string::~string(local_1168);
  std::allocator<char>::~allocator((allocator<char> *)&local_1169);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1190,"",&local_1191);
  booster::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_stack_ffffffffffffe1e0,n);
  check_less<std::__cxx11::string,booster::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
            (in_stack_fffffffffffff790,in_stack_fffffffffffff7a0);
  std::__cxx11::string::~string(local_1190);
  std::allocator<char>::~allocator((allocator<char> *)&local_1191);
  booster::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_stack_ffffffffffffe1e0,n);
  booster::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_stack_ffffffffffffe1e0,n);
  booster::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  bVar1 = std::operator==(pbStack_11a8,local_11b0);
  std::__cxx11::string::~string(local_11d0);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1378);
    poVar3 = std::operator<<((ostream *)local_1378,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x60);
    std::operator<<(poVar3," cm[1]+cm[4]==\"ab\"");
    local_1399 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_1398);
    local_1399 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_stack_ffffffffffffe1e0,n);
  booster::operator+((value_type *)in_stack_ffffffffffffe208,
                     (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT17(in_stack_ffffffffffffe207,in_stack_ffffffffffffe200));
  bVar1 = std::operator==(pbStack_11a8,local_11b0);
  std::__cxx11::string::~string(local_13c0);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1550);
    poVar3 = std::operator<<((ostream *)local_1550,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x61);
    std::operator<<(poVar3," \"a\"+cm[4]==\"ab\"");
    local_1571 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_1570);
    local_1571 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_stack_ffffffffffffe1e0,n);
  booster::operator+((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffe208,
                     (value_type *)CONCAT17(in_stack_ffffffffffffe207,in_stack_ffffffffffffe200));
  bVar1 = std::operator==(pbStack_11a8,local_11b0);
  std::__cxx11::string::~string(local_1598);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1728);
    poVar3 = std::operator<<((ostream *)local_1728,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x62);
    std::operator<<(poVar3," cm[1]+\"b\"==\"ab\"");
    local_1749 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_1748);
    local_1749 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1790,"a",&local_1791);
  booster::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_stack_ffffffffffffe1e0,n);
  booster::operator+(in_stack_ffffffffffffe208,
                     (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT17(in_stack_ffffffffffffe207,in_stack_ffffffffffffe200));
  bVar2 = std::operator==(pbStack_11a8,local_11b0);
  std::__cxx11::string::~string(local_1770);
  std::__cxx11::string::~string(local_1790);
  std::allocator<char>::~allocator((allocator<char> *)&local_1791);
  if ((bVar2 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_1928);
    poVar3 = std::operator<<((ostream *)local_1928,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,99);
    std::operator<<(poVar3," std::string(\"a\")+cm[4]==\"ab\"");
    local_1949 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_1948);
    local_1949 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_stack_ffffffffffffe1e0,n);
  l = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_19a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_19a9 + 1),"b",(allocator *)l);
  booster::operator+(l,(string_type *)CONCAT17(in_stack_ffffffffffffe207,in_stack_ffffffffffffe200))
  ;
  bVar2 = std::operator==(pbStack_11a8,local_11b0);
  std::__cxx11::string::~string(local_1970);
  std::__cxx11::string::~string((string *)(local_19a9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_19a9);
  if ((bVar2 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_1b28);
    poVar3 = std::operator<<((ostream *)local_1b28,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,100);
    std::operator<<(poVar3," cm[1]+std::string(\"b\")==\"ab\"");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_1b48);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x1163dc);
  return;
}

Assistant:

void test_match(Param str)
{
	MatchType cm;
	TEST(booster::regex_match(str,cm,booster::regex("(a)(a)(x)?(b)")));
	TEST(cm.size()==5);
	TEST(cm[0].matched && cm[1].matched && cm[1].matched && !cm[3].matched && cm[4].matched);

	TEST(cm[0]=="aab");
	TEST(cm[1]=="a");
	TEST(cm[2]=="a");
	TEST(cm[3]!="a");
	TEST(cm[3]=="");
	TEST(cm[4]=="b");

	check_equal(cm[1],cm[2]);
	check_less(cm[1],cm[4]);
	check_less(cm[3],cm[1]);

	check_equal(cm[1],"a");
	check_less(cm[1],"b");
	check_less("",cm[1]);

	check_equal(cm[1],std::string("a"));
	check_less(cm[1],std::string("b"));
	check_less(std::string(""),cm[1]);

	TEST(cm[1]+cm[4]=="ab");
	TEST("a"+cm[4]=="ab");
	TEST(cm[1]+"b"=="ab");
	TEST(std::string("a")+cm[4]=="ab");
	TEST(cm[1]+std::string("b")=="ab");
}